

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hh
# Opt level: O0

int anon_unknown.dwarf_8f23a::digittoint(int c)

{
  int local_c;
  int c_local;
  
  switch(c) {
  case 0x31:
    local_c = 1;
    break;
  case 0x32:
    local_c = 2;
    break;
  case 0x33:
    local_c = 3;
    break;
  case 0x34:
    local_c = 4;
    break;
  case 0x35:
    local_c = 5;
    break;
  case 0x36:
    local_c = 6;
    break;
  case 0x37:
    local_c = 7;
    break;
  case 0x38:
    local_c = 8;
    break;
  case 0x39:
    local_c = 9;
    break;
  default:
  case 0x30:
    local_c = 0;
    break;
  case 0x61:
    local_c = 10;
    break;
  case 0x62:
    local_c = 0xb;
    break;
  case 99:
    local_c = 0xc;
    break;
  case 100:
    local_c = 0xd;
    break;
  case 0x65:
    local_c = 0xe;
    break;
  case 0x66:
    local_c = 0xf;
  }
  return local_c;
}

Assistant:

inline int digittoint(int c)
	{
		switch (c)
		{
			default:
			case '0': return 0;
			case '1': return 1;
			case '2': return 2;
			case '3': return 3;
			case '4': return 4;
			case '5': return 5;
			case '6': return 6;
			case '7': return 7;
			case '8': return 8;
			case '9': return 9;
			case 'a': return 10;
			case 'b': return 11;
			case 'c': return 12;
			case 'd': return 13;
			case 'e': return 14;
			case 'f': return 15;
		}
	}